

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

Var BailOutRecord::BailOutHelper
              (JavascriptCallStackLayout *layout,ScriptFunction **functionRef,Arguments *args,
              bool isInlinee,BailOutRecord *bailOutRecord,uint32 bailOutOffset,void *returnAddress,
              BailOutKind bailOutKind,Var *registerSaves,BailOutReturnValue *bailOutReturnValue,
              Var *pArgumentsObject,Var branchValue,void *argoutRestoreAddress)

{
  undefined1 *puVar1;
  ImplicitCallFlags flags;
  Type TVar2;
  LocalFunctionId LVar3;
  ThreadContext *pTVar4;
  Utf8SourceInfo *pUVar5;
  DebugManager *this;
  JavascriptFunction *pJVar6;
  code *pcVar7;
  ushort uVar8;
  ScriptContext *pSVar9;
  JavascriptCallStackLayout *pJVar10;
  Arguments *pAVar11;
  bool bVar12;
  byte bVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  RegSlot RVar18;
  uint32 uVar19;
  RegSlot localRegisterID;
  RegSlot localRegisterID_00;
  FunctionBody *pFVar20;
  DebuggingFlags *this_00;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 *puVar21;
  undefined4 extraout_var_02;
  char16 *pcVar22;
  char16 *pcVar23;
  char *pcVar24;
  undefined4 extraout_var_03;
  Var pvVar25;
  Var pvVar26;
  Var *allocation;
  void *pvVar27;
  LoopHeader *loopHeaderArray;
  Var *ppvVar28;
  JavascriptGenerator *this_01;
  ForInObjectEnumerator *pFVar29;
  Var *ppvVar30;
  FrameDisplay *pFVar31;
  ScriptFunction *pSVar32;
  DynamicProfileInfo *this_02;
  FunctionInfo *pFVar33;
  undefined7 in_register_00000009;
  GlobalBailOutRecordDataTable *pGVar34;
  Var *ppvVar35;
  BailOutRecord *pBVar36;
  Var *stackAllocation;
  uint i;
  uint32 index;
  ulong uVar37;
  ulong uVar38;
  ScriptFunction *pSVar39;
  ScriptFunction *function;
  Var local_138;
  char16 debugStringBuffer [42];
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_d8;
  ArenaAllocator *tmpAlloc;
  JavascriptGenerator *generator;
  bool local_c0;
  uint local_a8;
  uint local_a4;
  ScriptFunction **local_90;
  undefined4 *local_88;
  NumberSet *local_80;
  ScriptContext *local_78;
  JavascriptCallStackLayout *local_70;
  ThreadContext *local_68;
  Arguments *local_60;
  ScriptFunction *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  BailOutRecord *local_48;
  byte local_3d;
  uint local_3c;
  FunctionBody *local_38;
  
  ppvVar35 = &local_138;
  local_50 = (undefined4)CONCAT71(in_register_00000009,isInlinee);
  local_58 = *functionRef;
  local_90 = functionRef;
  local_70 = layout;
  local_48 = bailOutRecord;
  local_3c = bailOutOffset;
  pFVar20 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_58);
  local_78 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar20);
  pTVar4 = local_78->threadContext;
  pTVar4->disableImplicitFlags = DisableImplicitNoFlag;
  pUVar5 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  bVar13 = pUVar5->field_0xa8;
  uVar37 = CONCAT71((int7)((ulong)functionRef >> 8),bVar13) & 0xffffffff;
  local_3d = (bVar13 & 0x40) >> 6 &
             ((byte)uVar37 >> 5 | (pUVar5->debugModeSource).ptr != (uchar *)0x0);
  local_4c = (undefined4)CONCAT71((int7)(uVar37 >> 8),1);
  local_60 = args;
  local_38 = pFVar20;
  if (local_3d == 1) {
    this = pTVar4->debugManager;
    this_00 = Js::DebugManager::GetDebuggingFlags(this);
    uVar15 = DebuggingFlags::GetByteCodeOffsetAfterIgnoreException(this_00);
    if (((bailOutKind >> 0x1b & 1) != 0) || (uVar15 != 0xffffffff)) {
      uVar16 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this_00);
      if (uVar16 == 0) {
LAB_003fa9b9:
        if (uVar15 == 0xffffffff) {
          uVar16 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this_00);
          if (uVar16 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar21 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                ,0x5af,
                                "(!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber))"
                                ,
                                "!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber)"
                               );
            if (!bVar12) goto LAB_003fc062;
            *puVar21 = 0;
          }
          goto LAB_003fadbb;
        }
        bVar12 = Js::StepController::IsActive(&this->stepController);
        pFVar20 = local_38;
        if (bVar12) {
          (this->stepController).frameAddrWhenSet = 0;
        }
        if (((bailOutKind >> 0x1b & 1) == 0) || (uVar15 != local_3c)) {
          uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
          pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
          if (pFVar33 == (FunctionInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar21 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
            if (!bVar12) goto LAB_003fc062;
            *puVar21 = 0;
            pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
            args = local_60;
          }
          bVar12 = Js::Phases::IsEnabled
                             ((Phases *)&DAT_015b6718,BailOutPhase,uVar16,pFVar33->functionId);
          if (((bVar12) &&
              ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015bc46a == '\x01')))) &&
             ((DAT_015bf388 == DAT_015bf390 ||
              (bVar12 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar12))))
          {
            pFVar20 = local_38;
            iVar17 = (*(local_38->super_ParseableFunctionInfo).super_FunctionProxy.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject[7])(local_38);
            local_68 = (ThreadContext *)CONCAT44(extraout_var_00,iVar17);
            pcVar22 = Js::FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)pFVar20,(wchar (*) [42])&local_138);
            pcVar23 = Js::OpCodeUtil::GetOpCodeName(local_48->bailOutOpcode);
            pcVar24 = GetBailOutKindName(BailOutIgnoreException);
            Output::Print(L"BailOut: changing due to ignore exception: function: %s (%s) offset: #%04x -> #%04x Opcode: %s Treating as: %S"
                          ,local_68,pcVar22,(ulong)local_3c,(ulong)uVar15,pcVar23,pcVar24);
            if (bailOutKind != BailOutInvalid) {
              pcVar24 = GetBailOutKindName(bailOutKind);
              Output::Print(L" Kind: %S",pcVar24);
            }
            Output::Print(L"\n");
            args = local_60;
          }
          pFVar20 = local_38;
          uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
          pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
          if (pFVar33 == (FunctionInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar21 = 1;
            bVar12 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
            if (!bVar12) goto LAB_003fc062;
            *puVar21 = 0;
            pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
            args = local_60;
          }
          bVar12 = Js::Phases::IsEnabled
                             ((Phases *)&DAT_015bc490,BailOutPhase,uVar16,pFVar33->functionId);
          if (((bVar12) &&
              ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015bc46a == '\x01')))) &&
             ((DAT_015bf388 == DAT_015bf390 ||
              (bVar12 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar12))))
          {
            iVar17 = (*(local_38->super_ParseableFunctionInfo).super_FunctionProxy.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject[7])();
            pcVar22 = Js::OpCodeUtil::GetOpCodeName(local_48->bailOutOpcode);
            pcVar24 = GetBailOutKindName(BailOutIgnoreException);
            Output::Print(L"BailOut: changing due to ignore exception: function %s, Opcode: %s, Treating as: %S"
                          ,CONCAT44(extraout_var_01,iVar17),pcVar22,pcVar24);
            if (bailOutKind != BailOutInvalid) {
              pcVar24 = GetBailOutKindName(bailOutKind);
              Output::Print(L" Kind: %S",pcVar24);
            }
            Output::Print(L"\n");
            args = local_60;
          }
          local_4c = 0;
        }
        else {
          local_4c = 0;
          uVar15 = local_3c;
        }
      }
      else {
        uVar16 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this_00);
        pFVar20 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_58);
        args = local_60;
        if (uVar16 == (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.m_functionNumber)
        goto LAB_003fa9b9;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar21 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                            ,0x5ab,"(isSameFunction)",
                            "Bailout due to ignore exception in different function, can\'t bail out cross functions!"
                           );
        if (!bVar12) goto LAB_003fc062;
        *puVar21 = 0;
        local_4c = (undefined4)CONCAT71(extraout_var,1);
        uVar15 = local_3c;
      }
      DebuggingFlags::ResetByteCodeOffsetAndFuncAfterIgnoreException(this_00);
      local_3c = uVar15;
    }
  }
LAB_003fadbb:
  pFVar20 = local_38;
  uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
  pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar33 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar21 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_003fc062;
    *puVar21 = 0;
    pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    pFVar20 = local_38;
  }
  bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar16,pFVar33->functionId);
  if (((bVar12) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015bc46a == '\x01'))))
     && ((DAT_015bf388 == DAT_015bf390 ||
         (bVar12 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar12)))) {
    iVar17 = (*(pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar20);
    pcVar22 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)pFVar20,(wchar (*) [42])&local_138);
    pcVar23 = Js::OpCodeUtil::GetOpCodeName(local_48->bailOutOpcode);
    Output::Print(L"BailOut: function: %s (%s) offset: #%04x Opcode: %s",
                  CONCAT44(extraout_var_02,iVar17),pcVar22,(ulong)local_3c,pcVar23);
    if (bailOutKind != BailOutInvalid) {
      pcVar24 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar24);
    }
    Output::Print(L"\n");
    pFVar20 = local_38;
  }
  uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
  pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar33 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar21 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_003fc062;
    *puVar21 = 0;
    pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    pFVar20 = local_38;
  }
  bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,BailOutPhase,uVar16,pFVar33->functionId);
  if (((bVar12) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_015bc46a == '\x01'))))
     && ((DAT_015bf388 == DAT_015bf390 ||
         (bVar12 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar12)))) {
    iVar17 = (*(pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar20);
    pcVar22 = Js::OpCodeUtil::GetOpCodeName(local_48->bailOutOpcode);
    Output::Print(L"BailOut: function %s, Opcode: %s",CONCAT44(extraout_var_03,iVar17),pcVar22);
    if (bailOutKind != BailOutInvalid) {
      GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S");
    }
    Output::Print(L"\n");
  }
  if (((char)local_50 != '\0') && (((ulong)args->Info & 0xffffff) != 0)) {
    local_88 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_68 = (ThreadContext *)&DAT_015b6718;
    local_80 = (NumberSet *)&DAT_015bf368;
    uVar37 = 0;
    do {
      pFVar20 = local_38;
      pvVar26 = args->Values[uVar37];
      if (DAT_015bc46a == '\x01') {
        uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
        pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar33 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar21 = local_88;
          *local_88 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                              ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar12) goto LAB_003fc062;
          *puVar21 = 0;
          pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar12 = Js::Phases::IsEnabled((Phases *)local_68,BailOutPhase,uVar16,pFVar33->functionId);
        if ((bVar12) &&
           ((DAT_015bf388 == DAT_015bf390 ||
            (bVar12 = Js::NumberSet::Contains(local_80,bailOutKind), bVar12)))) {
          Output::Print(L"BailOut:   Argument #%3u: value: 0x%p",uVar37 & 0xffffffff,pvVar26);
        }
      }
      pvVar25 = Js::JavascriptOperators::BoxStackInstance(pvVar26,local_78,true,false);
      pFVar20 = local_38;
      args = local_60;
      if ((pvVar25 != pvVar26) && (local_60->Values[uVar37] = pvVar25, DAT_015bc46a == '\x01')) {
        uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
        pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar33 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar21 = local_88;
          *local_88 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                              ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar12) goto LAB_003fc062;
          *puVar21 = 0;
          pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar12 = Js::Phases::IsEnabled((Phases *)local_68,BailOutPhase,uVar16,pFVar33->functionId);
        args = local_60;
        if ((bVar12) &&
           ((DAT_015bf388 == DAT_015bf390 ||
            (bVar12 = Js::NumberSet::Contains(local_80,bailOutKind), bVar12)))) {
          Output::Print(L" (Boxed: 0x%p)");
        }
      }
      pFVar20 = local_38;
      if (DAT_015bc46a == '\x01') {
        uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
        pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar33 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar21 = local_88;
          *local_88 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                              ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar12) goto LAB_003fc062;
          *puVar21 = 0;
          pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar12 = Js::Phases::IsEnabled((Phases *)local_68,BailOutPhase,uVar16,pFVar33->functionId);
        if ((bVar12) &&
           ((DAT_015bf388 == DAT_015bf390 ||
            (bVar12 = Js::NumberSet::Contains(local_80,bailOutKind), bVar12)))) {
          Output::Print(L"\n");
        }
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (SUB84(args->Info,0) & 0xffffff));
  }
  pFVar20 = local_38;
  pSVar39 = local_58;
  pSVar9 = local_78;
  pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar33 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar21 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_003fc062;
    *puVar21 = 0;
    pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar33->functionBodyImpl).ptr != pFVar20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar21 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                        "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar12) goto LAB_003fc062;
    *puVar21 = 0;
    pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  pBVar36 = local_48;
  if ((pFVar33->attributes & (Async|Generator)) == None) {
    Js::InterpreterStackFrame::Setup::Setup
              ((Setup *)&tmpAlloc,pSVar39,args,true,(bool)(char)local_50,false);
    uVar38 = (ulong)local_a4;
    uVar37 = uVar38 + local_a8;
    if (uVar37 < 0x8001) {
      ThreadContext::ProbeStack(pSVar9->threadContext,uVar37 * 8 + 0x4000,pSVar9,returnAddress);
      allocation = (Var *)((long)&local_138 - (uVar37 * 8 + 0xf & 0xfffffffffffffff0));
      ppvVar30 = allocation;
LAB_003fb5b1:
      stackAllocation = (Var *)0x0;
    }
    else {
      local_d8 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0;
      Js::ScriptContext::EnsureInterpreterArena(pSVar9,(ArenaAllocator **)&local_d8);
      allocation = (Var *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                          ::AllocInternal(local_d8,(ulong)local_a8 << 3);
      ppvVar30 = &local_138;
      if (uVar38 == 0) goto LAB_003fb5b1;
      ThreadContext::ProbeStack(pSVar9->threadContext,uVar38 * 8 + 0x4000,pSVar9,returnAddress);
      ppvVar30 = (Var *)((long)&local_138 - (uVar38 * 8 + 0xf & 0xfffffffffffffff0));
      stackAllocation = ppvVar30;
    }
    pFVar20 = local_38;
    pBVar36 = local_48;
    ppvVar30[-1] = (Var)0x3fb5c9;
    pvVar27 = Js::FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar20,LoopHeaderArray);
    if (pvVar27 == (void *)0x0) {
      loopHeaderArray = (LoopHeader *)0x0;
    }
    else {
      ppvVar30[-1] = (Var)0x3fb5d6;
      loopHeaderArray = Js::FunctionBody::GetLoopHeaderArrayPtr(pFVar20);
    }
    pJVar10 = local_70;
    ppvVar30[-1] = (Var)0x3fb5e7;
    ppvVar28 = Js::JavascriptCallStackLayout::GetArgv(pJVar10);
    ppvVar30[-2] = (Var)0xfefefefefefefefe;
    ppvVar30[-1] = (Var)0xfefefefefefefefe;
    ppvVar30[-3] = ppvVar30 + -2;
    ppvVar30[-4] = ppvVar28;
    ppvVar30[-5] = (Var)0x3fb619;
    this_01 = (JavascriptGenerator *)
              Js::InterpreterStackFrame::Setup::InitializeAllocation
                        ((Setup *)&tmpAlloc,allocation,stackAllocation,false,false,loopHeaderArray,
                         (DWORD_PTR)ppvVar30[-4],ppvVar30[-3]);
    ppvVar35 = ppvVar30 + -2;
    ppvVar30[-3] = (Var)0x3fb62d;
    Js::ByteCodeReader::Create((ByteCodeReader *)this_01,pFVar20,0);
    pSVar39 = local_58;
  }
  else {
    if (((ulong)args->Info & 0xffffff) != 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x600,"(args.Info.Count == 2)",
                          "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object"
                         );
      if (!bVar12) goto LAB_003fc062;
      *puVar21 = 0;
    }
    pvVar26 = Js::Arguments::operator[](args,0);
    tmpAlloc = (ArenaAllocator *)Js::VarTo<Js::JavascriptGenerator>(pvVar26);
    this_01 = (JavascriptGenerator *)(((JavascriptGenerator *)tmpAlloc)->frame).ptr;
    if (this_01 == (JavascriptGenerator *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x608,"(newInstance != nullptr)","newInstance != nullptr");
      if (!bVar12) goto LAB_003fc062;
      *puVar21 = 0;
    }
    Js::InterpreterStackFrame::ResetOut((InterpreterStackFrame *)this_01);
    *(ArenaAllocator ***)&this_01[1].bailInSymbolsTraceArrayCount = &tmpAlloc;
  }
  pJVar10 = local_70;
  iVar17 = pBVar36->globalBailOutRecordTable->forInEnumeratorArrayRestoreOffset;
  if (iVar17 != -1) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb646;
    pFVar29 = Js::JavascriptCallStackLayout::GetForInObjectEnumeratorArrayAtOffset(pJVar10,iVar17);
    this_01[1].super_DynamicObject.auxSlots.ptr = (WriteBarrierPtr<void> *)pFVar29;
  }
  this_01[3].args.Info = (Type)pBVar36->ehBailoutData;
  uVar8 = (ushort)*(undefined4 *)((long)&this_01[2].super_DynamicObject.auxSlots.ptr + 4);
  uVar14 = uVar8 | 8;
  *(ushort *)((long)&this_01[2].super_DynamicObject.auxSlots.ptr + 4) = uVar14;
  if (bailOutKind == BailOutOnArrayAccessHelperCall) {
    uVar14 = 0x18;
LAB_003fb683:
    uVar14 = uVar14 | uVar8;
    *(ushort *)((long)&this_01[2].super_DynamicObject.auxSlots.ptr + 4) = uVar14;
  }
  else if (bailOutKind == BailOutOnNotNativeArray) {
    uVar14 = 0x88;
    goto LAB_003fb683;
  }
  if ((char)local_50 != '\0') {
    *(ushort *)((long)&this_01[2].super_DynamicObject.auxSlots.ptr + 4) = uVar14 | 0x40;
  }
  pTVar4 = (ThreadContext *)
           this_01[1].super_DynamicObject.field_1.objectArray.ptr[0x1a].super_DynamicObject.auxSlots
           .ptr;
  if ((bailOutKind & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb6c0;
    ThreadContext::ClearImplicitCallFlags(pTVar4);
  }
  local_68 = pTVar4;
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb6cc;
  pFVar20 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar39);
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb6d4;
  RVar18 = Js::FunctionBody::GetVarCount(pFVar20);
  if (RVar18 != 0) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb6e2;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar39);
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb6ef;
    uVar19 = Js::FunctionBody::GetCountField(pFVar20,ConstantCount);
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb709;
    memset(&this_01[3].scriptFunction + uVar19,0,(ulong)RVar18 << 3);
  }
  pFVar20 = local_38;
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb715;
  RVar18 = Js::FunctionBody::GetLocalFrameDisplayRegister(pFVar20);
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb720;
  localRegisterID = Js::FunctionBody::GetLocalClosureRegister(pFVar20);
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb72b;
  localRegisterID_00 = Js::FunctionBody::GetParamClosureRegister(pFVar20);
  pJVar10 = local_70;
  if ((char)local_50 == '\0') {
    if (RVar18 != 0xffffffff) {
      TVar2 = (local_38->super_ParseableFunctionInfo).m_inParamCount;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb752;
      ppvVar30 = Js::JavascriptCallStackLayout::GetArgv(pJVar10);
      pBVar36 = local_48;
      pFVar31 = (FrameDisplay *)ppvVar30[(ulong)(TVar2 == 0) - 7];
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb763;
      Js::InterpreterStackFrame::SetLocalFrameDisplay((InterpreterStackFrame *)this_01,pFVar31);
    }
    pJVar10 = local_70;
    if (localRegisterID != 0xffffffff) {
      TVar2 = (local_38->super_ParseableFunctionInfo).m_inParamCount;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb78a;
      ppvVar30 = Js::JavascriptCallStackLayout::GetArgv(pJVar10);
      pBVar36 = local_48;
      pvVar26 = *(Var *)((long)ppvVar30 + ((ulong)(TVar2 == 0) << 3 | 0xffffffffffffffc0));
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb79a;
      Js::InterpreterStackFrame::SetLocalClosure((InterpreterStackFrame *)this_01,pvVar26);
    }
  }
  pJVar10 = local_70;
  pSVar9 = local_78;
  *(ulong *)((long)ppvVar35 + -0x18) = (ulong)(byte)local_4c;
  *(void **)((long)ppvVar35 + -0x20) = returnAddress;
  *(Var *)((long)ppvVar35 + -0x28) = branchValue;
  *(Var **)((long)ppvVar35 + -0x30) = pArgumentsObject;
  *(BailOutReturnValue **)((long)ppvVar35 + -0x38) = bailOutReturnValue;
  *(Var **)((long)ppvVar35 + -0x40) = registerSaves;
  *(undefined8 *)((long)ppvVar35 + -0x48) = 0x3fb7cb;
  RestoreValues(pBVar36,bailOutKind,pJVar10,(InterpreterStackFrame *)this_01,pSVar9,false,
                *(Var **)((long)ppvVar35 + -0x40),*(BailOutReturnValue **)((long)ppvVar35 + -0x38),
                *(Var **)((long)ppvVar35 + -0x30),*(Var *)((long)ppvVar35 + -0x28),
                *(void **)((long)ppvVar35 + -0x20),*(bool *)((long)ppvVar35 + -0x18),
                *(void **)((long)ppvVar35 + -0x10));
  if (RVar18 != 0xffffffff) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb7e0;
    pFVar31 = (FrameDisplay *)
              Js::InterpreterStackFrame::GetNonVarReg((InterpreterStackFrame *)this_01,RVar18);
    if (pFVar31 != (FrameDisplay *)0x0) {
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb7f0;
      Js::InterpreterStackFrame::SetLocalFrameDisplay((InterpreterStackFrame *)this_01,pFVar31);
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb7fd;
      Js::InterpreterStackFrame::SetNonVarReg((InterpreterStackFrame *)this_01,RVar18,(Var)0x0);
    }
  }
  if (localRegisterID != 0xffffffff) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb80e;
    pvVar26 = Js::InterpreterStackFrame::GetNonVarReg
                        ((InterpreterStackFrame *)this_01,localRegisterID);
    if (pvVar26 != (Var)0x0) {
      puVar1 = &pBVar36->globalBailOutRecordTable->field_0x2c;
      *puVar1 = *puVar1 | 0x20;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb826;
      Js::InterpreterStackFrame::SetLocalClosure((InterpreterStackFrame *)this_01,pvVar26);
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb833;
      Js::InterpreterStackFrame::SetNonVarReg
                ((InterpreterStackFrame *)this_01,localRegisterID,(Var)0x0);
    }
  }
  if (localRegisterID_00 != 0xffffffff) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb842;
    pvVar26 = Js::InterpreterStackFrame::GetNonVarReg
                        ((InterpreterStackFrame *)this_01,localRegisterID_00);
    if (pvVar26 != (Var)0x0) {
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb852;
      Js::InterpreterStackFrame::SetParamClosure((InterpreterStackFrame *)this_01,pvVar26);
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb85e;
      Js::InterpreterStackFrame::SetNonVarReg
                ((InterpreterStackFrame *)this_01,localRegisterID_00,(Var)0x0);
    }
  }
  pSVar9 = local_78;
  pGVar34 = pBVar36->globalBailOutRecordTable;
  bVar13 = pGVar34->field_0x2c;
  if ((bVar13 & 0x10) != 0) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb888;
    Js::InterpreterStackFrame::TrySetFrameObjectInHeapArgObj
              ((InterpreterStackFrame *)this_01,pSVar9,(bool)((bVar13 & 8) >> 3),
               (bool)((bVar13 & 0x20) >> 5));
    pGVar34 = pBVar36->globalBailOutRecordTable;
    bVar13 = pGVar34->field_0x2c;
  }
  pFVar20 = local_38;
  pGVar34->field_0x2c = bVar13 & 0xdf;
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb8a5;
  uVar19 = Js::FunctionBody::GetCountField(pFVar20,InnerScopeCount);
  if (uVar19 != 0) {
    index = 0;
    do {
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb8b6;
      RVar18 = Js::FunctionBody::GetFirstInnerScopeRegister(pFVar20);
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb8c5;
      pvVar26 = Js::InterpreterStackFrame::GetNonVarReg
                          ((InterpreterStackFrame *)this_01,RVar18 + index);
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb8d3;
      Js::InterpreterStackFrame::SetInnerScopeFromIndex
                ((InterpreterStackFrame *)this_01,index,pvVar26);
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb8e0;
      Js::InterpreterStackFrame::SetNonVarReg
                ((InterpreterStackFrame *)this_01,RVar18 + index,(Var)0x0);
      index = index + 1;
    } while (uVar19 != index);
  }
  function = local_58;
  *(byte *)((long)&this_01[2].super_DynamicObject.auxSlots.ptr + 6) =
       *(byte *)((long)&this_01[2].super_DynamicObject.auxSlots.ptr + 6) & 0xfe |
       ((bailOutKind & BailOutForDebuggerBits) == BailOutInvalid || local_3c != 0);
  pSVar39 = *local_90;
  if (local_58 != pSVar39) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb928;
    pSVar32 = (ScriptFunction *)
              Js::StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)function);
    if (pSVar39 != pSVar32) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb93b;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb94b;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb973;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x6e6,
                          "(currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function))"
                          ,
                          "currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function)"
                         );
      if (!bVar12) goto LAB_003fc062;
      *puVar21 = 0;
      function = local_58;
    }
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb991;
    Js::InterpreterStackFrame::SetExecutingStackFunction((InterpreterStackFrame *)this_01,pSVar39);
  }
  pBVar36 = local_48;
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb99d;
  UpdatePolymorphicFieldAccess((JavascriptFunction *)function,pBVar36);
  pFVar20 = local_38;
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb9a9;
  uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
  pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar33 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb9c3;
    Js::Throw::LogAssert();
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb9d3;
    puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar21 = 1;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fb9fb;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                        ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_003fc062;
    *puVar21 = 0;
    pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    function = local_58;
  }
  LVar3 = pFVar33->functionId;
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fba31;
  bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,BailOutPhase,uVar16,LVar3);
  pFVar20 = local_38;
  if (bVar12) {
LAB_003fbad1:
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbad6;
    Output::Flush();
  }
  else {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fba45;
    uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
    pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar33 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fba5f;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fba6f;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fba97;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar12) goto LAB_003fc062;
      *puVar21 = 0;
      pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      function = local_58;
    }
    LVar3 = pFVar33->functionId;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbacd;
    bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar16,LVar3);
    if (bVar12) goto LAB_003fbad1;
  }
  pFVar20 = local_38;
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbadf;
  Js::FunctionBody::BeginExecution(pFVar20);
  uVar15 = local_3c;
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbaea;
  Js::ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this_01,uVar15);
  pTVar4 = (ThreadContext *)
           this_01[1].super_DynamicObject.field_1.objectArray.ptr[0x1a].super_DynamicObject.auxSlots
           .ptr;
  local_c0 = false;
  this_01[1].args.Values = (Type)returnAddress;
  this_01[1].scriptFunction.ptr = (ScriptFunction *)register0x00000020;
  tmpAlloc = (ArenaAllocator *)pTVar4;
  generator = this_01;
  if ((*(byte *)(*(long *)&this_01[1].state + 0x46) & 2) == 0) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbb35;
    ThreadContext::PushInterpreterFrame(pTVar4,(InterpreterStackFrame *)this_01);
  }
  else {
    local_c0 = true;
  }
  if (local_3d == 0) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbb56;
    pvVar26 = Js::InterpreterStackFrame::Process((InterpreterStackFrame *)this_01);
  }
  else {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbb4c;
    pvVar26 = Js::InterpreterStackFrame::DebugProcess((InterpreterStackFrame *)this_01);
  }
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbb65;
  Js::InterpreterStackFrame::PushPopFrameHelper::~PushPopFrameHelper
            ((PushPopFrameHelper *)&tmpAlloc);
  pFVar20 = local_38;
  *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbb71;
  Js::FunctionBody::EndExecution(pFVar20);
  if ((pFVar20->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbb83;
    this_02 = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar20);
    flags = local_68->implicitCallFlags;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbb96;
    Js::DynamicProfileInfo::RecordImplicitCallFlags(this_02,flags);
  }
  if (DAT_015bc46a == '\x01') {
    pJVar6 = (JavascriptFunction *)this_01[1].frame.ptr;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbbb6;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar6);
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbbbe;
    uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
    pJVar6 = (JavascriptFunction *)this_01[1].frame.ptr;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbbcd;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar6);
    pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar33 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbbe7;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbbf7;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbc1f;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar12) goto LAB_003fc062;
      *puVar21 = 0;
      pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    LVar3 = pFVar33->functionId;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbc55;
    bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar16,LVar3);
    function = local_58;
    if (bVar12) {
      if (DAT_015bf388 != DAT_015bf390) {
        *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbc7f;
        bVar12 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind);
        if (!bVar12) goto LAB_003fbc94;
      }
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbc94;
      Output::Print(L"BailOut:   Return Value: 0x%p",pvVar26);
    }
  }
LAB_003fbc94:
  pAVar11 = local_60;
  if ((local_48->globalBailOutRecordTable->field_0x2c & 2) != 0) {
    pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar33 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbcc4;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbcd4;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbcfc;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x4ff,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar12) goto LAB_003fc062;
      *puVar21 = 0;
      pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(pFVar33->functionBodyImpl).ptr != local_38) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbd26;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbd36;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbd5e;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x500,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                          "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar12) goto LAB_003fc062;
      *puVar21 = 0;
      pFVar33 = (local_38->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((pFVar33->attributes & Generator) != None) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbd88;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbd98;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbdc0;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x70c,"(!executeFunction->IsGenerator())",
                          "Generator functions are not expected to be inlined. If this changes then need to use the real user args here from the generator object"
                         );
      if (!bVar12) goto LAB_003fc062;
      *puVar21 = 0;
    }
    if (((ulong)pAVar11->Info & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbde6;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbdf6;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbe1e;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                          ,0x70d,"(args.Info.Count != 0)","args.Info.Count != 0");
      if (!bVar12) goto LAB_003fc062;
      *puVar21 = 0;
    }
    pvVar25 = *pAVar11->Values;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbe41;
    pvVar25 = Js::JavascriptFunction::FinishConstructor
                        (pvVar26,pvVar25,(JavascriptFunction *)function,false);
    pSVar9 = local_78;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbe57;
    pvVar26 = Js::JavascriptOperators::BoxStackInstance(pvVar25,pSVar9,true,false);
    if ((pvVar25 != pvVar26) && (DAT_015bc46a == '\x01')) {
      pJVar6 = (JavascriptFunction *)this_01[1].frame.ptr;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbe83;
      pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar6);
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbe8b;
      uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
      pJVar6 = (JavascriptFunction *)this_01[1].frame.ptr;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbe9a;
      pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar6);
      pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar33 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbeb4;
        Js::Throw::LogAssert();
        *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbec4;
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar21 = 1;
        *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbeec;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                            ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar12) goto LAB_003fc062;
        *puVar21 = 0;
        pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      LVar3 = pFVar33->functionId;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbf22;
      bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar16,LVar3);
      if (bVar12) {
        if (DAT_015bf388 != DAT_015bf390) {
          *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbf48;
          bVar12 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind);
          if (!bVar12) goto LAB_003fbf66;
        }
        *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbf5d;
        Output::Print(L" (Boxed: 0x%p)",pvVar26);
      }
    }
  }
LAB_003fbf66:
  if (DAT_015bc46a == '\x01') {
    pJVar6 = (JavascriptFunction *)this_01[1].frame.ptr;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbf7f;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar6);
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbf87;
    uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
    pJVar6 = (JavascriptFunction *)this_01[1].frame.ptr;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbf96;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar6);
    pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar33 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbfb3;
      Js::Throw::LogAssert();
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbfc3;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fbfeb;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                          ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar12) {
LAB_003fc062:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar21 = 0;
      pFVar33 = (pFVar20->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    LVar3 = pFVar33->functionId;
    *(undefined8 *)((long)ppvVar35 + -8) = 0x3fc018;
    bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar16,LVar3);
    if (bVar12) {
      if (DAT_015bf388 != DAT_015bf390) {
        *(undefined8 *)((long)ppvVar35 + -8) = 0x3fc03e;
        bVar12 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind);
        if (!bVar12) {
          return pvVar26;
        }
      }
      *(undefined8 *)((long)ppvVar35 + -8) = 0x3fc050;
      Output::Print(L"\n");
    }
  }
  return pvVar26;
}

Assistant:

Js::Var
BailOutRecord::BailOutHelper(Js::JavascriptCallStackLayout * layout, Js::ScriptFunction ** functionRef, Js::Arguments& args, const bool isInlinee,
    BailOutRecord const * bailOutRecord, uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::Var * registerSaves, BailOutReturnValue * bailOutReturnValue, Js::Var* pArgumentsObject,
    Js::Var branchValue, void * argoutRestoreAddress)
{
    Js::ScriptFunction * function = *functionRef;
    Js::FunctionBody * executeFunction = function->GetFunctionBody();
    Js::ScriptContext * functionScriptContext = executeFunction->GetScriptContext();

    // Whether to enter StartCall while doing RestoreValues. We don't do that when bailout due to ignore exception under debugger.
    bool useStartCall = true;

    // Clear the disable implicit call bit in case we bail from that region
    functionScriptContext->GetThreadContext()->ClearDisableImplicitFlags();

#ifdef ENABLE_SCRIPT_DEBUGGING
    bool isInDebugMode = executeFunction->IsInDebugMode();

    // Adjust bailout offset for debug mode (only scenario when we ignore exception).
    if (isInDebugMode)
    {
        Js::DebugManager* debugManager = functionScriptContext->GetThreadContext()->GetDebugManager();
        DebuggingFlags* debuggingFlags = debugManager->GetDebuggingFlags();
        int byteCodeOffsetAfterEx = debuggingFlags->GetByteCodeOffsetAfterIgnoreException();

        // Note that in case where bailout for ignore exception immediately follows regular bailout after a helper,
        // and ignore exception happens, we would bail out with non-exception kind with exception data recorded.
        // In this case we need to treat the bailout as ignore exception one and continue to next/set stmt.
        // This is fine because we only set byteCodeOffsetAfterEx for helpers (HelperMethodWrapper, when enabled)
        // and ignore exception is needed for all helpers.
        if ((bailOutKind & IR::BailOutIgnoreException) || byteCodeOffsetAfterEx != DebuggingFlags::InvalidByteCodeOffset)
        {
            bool needResetData = true;

            // Note: the func # in debuggingFlags still can be 0 in case actual b/o reason was not BailOutIgnoreException,
            //       but BailOutIgnoreException was on the OR'ed values for b/o check.
            bool isSameFunction = debuggingFlags->GetFuncNumberAfterIgnoreException() == DebuggingFlags::InvalidFuncNumber ||
                debuggingFlags->GetFuncNumberAfterIgnoreException() == function->GetFunctionBody()->GetFunctionNumber();
            AssertMsg(isSameFunction, "Bailout due to ignore exception in different function, can't bail out cross functions!");

            if (isSameFunction)
            {
                Assert(!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber));

                if (byteCodeOffsetAfterEx != DebuggingFlags::InvalidByteCodeOffset)
                {
                    // We got an exception in native frame, and need to bail out to interpreter
                    if (debugManager->stepController.IsActive())
                    {
                        // Native frame went away, and there will be interpreter frame on its place.
                        // Make sure that frameAddrWhenSet it less than current interpreter frame -- we use it to detect stack depth.
                        debugManager->stepController.SetFrameAddr(0);
                    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                    if (bailOutOffset != (uint)byteCodeOffsetAfterEx || !(bailOutKind & IR::BailOutIgnoreException))
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: changing due to ignore exception: function: %s (%s) offset: #%04x -> #%04x Opcode: %s Treating as: %S"), executeFunction->GetDisplayName(),
                            executeFunction->GetDebugNumberSet(debugStringBuffer), bailOutOffset, byteCodeOffsetAfterEx, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode), ::GetBailOutKindName(IR::BailOutIgnoreException));
                        BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: changing due to ignore exception: function %s, Opcode: %s, Treating as: %S"), executeFunction->GetDisplayName(),
                            Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode), ::GetBailOutKindName(IR::BailOutIgnoreException));
                    }
#endif

                    // Set the byte code offset to continue from next user statement.
                    bailOutOffset = byteCodeOffsetAfterEx;

                    // Reset current call count so that we don't do StartCall for inner calls. See WinBlue 272569.
                    // The idea is that next statement can never be set to the inner StartCall (another call as part of an ArgOut),
                    // it will be next statement in the function.
                    useStartCall = false;
                }
                else
                {
                    needResetData = false;
                }
            }

            if (needResetData)
            {
                // Reset/correct the flag as either we processed it or we need to correct wrong flag.
                debuggingFlags->ResetByteCodeOffsetAndFuncAfterIgnoreException();
            }
        }
    }
#endif

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: function: %s (%s) offset: #%04x Opcode: %s"), executeFunction->GetDisplayName(),
        executeFunction->GetDebugNumberSet(debugStringBuffer), bailOutOffset, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));
    BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: function %s, Opcode: %s"), executeFunction->GetDisplayName(), Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    if (isInlinee && args.Info.Count != 0)
    {
        // Box arguments. Inlinee arguments may be allocated on the stack.
        for(uint i = 0; i < args.Info.Count; ++i)
        {
            const Js::Var arg = args.Values[i];
            BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u("BailOut:   Argument #%3u: value: 0x%p"), i, arg);
            const Js::Var boxedArg = Js::JavascriptOperators::BoxStackInstance(arg, functionScriptContext, /* allowStackFunction */ true, /* deepCopy */ false);
            if(boxedArg != arg)
            {
                args.Values[i] = boxedArg;
                BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u(" (Boxed: 0x%p)"), boxedArg);
            }
            BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u("\n"));
        }
    }

    bool fReleaseAlloc = false;
    Js::InterpreterStackFrame* newInstance = nullptr;
    Js::Var* allocation = nullptr;

    if (executeFunction->IsCoroutine())
    {
        // If the FunctionBody is a generator then this call is being made by one of the three
        // generator resuming methods: next(), throw(), or return(). They all pass the generator
        // object as the first of two arguments. The real user arguments are obtained from the
        // generator object. The second argument is the resume yield object which is only needed
        // when resuming a generator and not needed when yielding from a generator, as is occurring here.
        AssertMsg(args.Info.Count == 2, "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object");
        Js::JavascriptGenerator* generator = Js::VarTo<Js::JavascriptGenerator>(args[0]);
        newInstance = generator->GetFrame();

        // The jit relies on the interpreter stack frame to store various information such as
        // for-in enumerators. Therefore, we always create an interpreter stack frame for generator
        // as part of the resume jump table, at the beginning of the jit'd function, if it doesn't
        // already exist.
        Assert(newInstance != nullptr);

        // BailOut will recompute OutArg pointers based on BailOutRecord. Reset them back
        // to initial position before that happens so that OP_StartCall calls don't accumulate
        // incorrectly over multiple yield bailouts.
        newInstance->ResetOut();

        // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
        // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
        newInstance->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);
    }
    else
    {
        Js::InterpreterStackFrame::Setup setup(function, args, true /* bailedOut */, isInlinee);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
        size_t varSizeInBytes;
        Js::Var *stackAllocation = nullptr;

        // If the locals area exceeds a certain limit, allocate it from a private arena rather than
        // this frame. The current limit is based on an old assert on the number of locals we would allow here.
        if ((varAllocCount + stackVarAllocCount) > Js::InterpreterStackFrame::LocalsThreshold)
        {
            ArenaAllocator *tmpAlloc = nullptr;
            fReleaseAlloc = functionScriptContext->EnsureInterpreterArena(&tmpAlloc);
            varSizeInBytes = varAllocCount * sizeof(Js::Var);
            allocation = (Js::Var*)tmpAlloc->Alloc(varSizeInBytes);
            if (stackVarAllocCount != 0)
            {
                size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Js::Var);
                PROBE_STACK_PARTIAL_INITIALIZED_BAILOUT_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + stackVarSizeInBytes, returnAddress);
                stackAllocation = (Js::Var*)_alloca(stackVarSizeInBytes);
            }
        }
        else
        {
            varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Js::Var);
            PROBE_STACK_PARTIAL_INITIALIZED_BAILOUT_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + varSizeInBytes, returnAddress);
            allocation = (Js::Var*)_alloca(varSizeInBytes);
        }

        Js::LoopHeader* loopHeaderArray = nullptr;

        if (executeFunction->GetHasAllocatedLoopHeaders())
        {
            // Loop header array is recycler allocated, so we push it on the stack
            // When we scan the stack, we'll recognize it as a recycler allocated
            // object, and mark it's contents and keep the individual loop header
            // wrappers alive
            loopHeaderArray = executeFunction->GetLoopHeaderArrayPtr();
        }

        // Set stack address for STEP_OUT/recursion detection for new frame.
        // This frame is originally jitted frame for which we create a new interpreter frame on top of it on stack,
        // set the stack address to some stack location that belong to the original jitted frame.
        DWORD_PTR frameStackAddr = reinterpret_cast<DWORD_PTR>(layout->GetArgv());

        // Initialize the interpreter stack frame (constants) but not the param, the bailout record will restore the value
#if DBG
        Js::Var invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
        memset(invalidStackVar, 0xFE, sizeof(Js::RecyclableObject));
#endif

        newInstance = setup.InitializeAllocation(allocation, stackAllocation, false, false, loopHeaderArray, frameStackAddr
#if DBG
            , invalidStackVar
#endif
            );

        newInstance->m_reader.Create(executeFunction);
    }

    int forInEnumeratorArrayRestoreOffset = bailOutRecord->globalBailOutRecordTable->forInEnumeratorArrayRestoreOffset;
    if (forInEnumeratorArrayRestoreOffset != -1)
    {
        newInstance->forInObjectEnumerators = layout->GetForInObjectEnumeratorArrayAtOffset(forInEnumeratorArrayRestoreOffset);
    }

    newInstance->ehBailoutData = bailOutRecord->ehBailoutData;
    newInstance->OrFlags(Js::InterpreterStackFrameFlags_FromBailOut);
    if (bailOutKind == IR::BailOutOnArrayAccessHelperCall)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall);
    }
    else if (bailOutKind == IR::BailOutOnNotNativeArray)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);
    }

    if (isInlinee)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_FromBailOutInInlinee);
    }

    ThreadContext *threadContext = newInstance->GetScriptContext()->GetThreadContext();

    // If this is a bailout on implicit calls, then it must have occurred at the current statement.
    // Otherwise, assume that the bits are stale, so clear them before entering the interpreter.
    if (!BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))
    {
        threadContext->ClearImplicitCallFlags();
    }

    Js::RegSlot varCount = function->GetFunctionBody()->GetVarCount();
    if (varCount)
    {
        Js::RegSlot constantCount = function->GetFunctionBody()->GetConstantCount();
        memset(newInstance->m_localSlots + constantCount, 0, varCount * sizeof(Js::Var));
    }

    Js::RegSlot localFrameDisplayReg = executeFunction->GetLocalFrameDisplayRegister();
    Js::RegSlot localClosureReg = executeFunction->GetLocalClosureRegister();
    Js::RegSlot paramClosureReg = executeFunction->GetParamClosureRegister();

    if (!isInlinee)
    {
        // If byte code was generated to do stack closures, restore closure pointers before the normal RestoreValues.
        // If code was jitted for stack closures, we have to restore the pointers from known stack locations.
        // (RestoreValues won't do it.) If stack closures were disabled for this function before we jitted,
        // then the values on the stack are garbage, but if we need them then RestoreValues will overwrite with
        // the correct values.
        if (localFrameDisplayReg != Js::Constants::NoRegister)
        {
            Js::FrameDisplay *localFrameDisplay;
            uintptr_t frameDisplayIndex = (uintptr_t)(
#if _M_IX86 || _M_AMD64
                executeFunction->GetInParamsCount() == 0 ?
                Js::JavascriptFunctionArgIndex_StackFrameDisplayNoArg :
#endif
                Js::JavascriptFunctionArgIndex_StackFrameDisplay) - 2;

            localFrameDisplay = (Js::FrameDisplay*)layout->GetArgv()[frameDisplayIndex];
            newInstance->SetLocalFrameDisplay(localFrameDisplay);
        }

        if (localClosureReg != Js::Constants::NoRegister)
        {
            Js::Var localClosure;
            uintptr_t scopeSlotsIndex = (uintptr_t)(
#if _M_IX86 || _M_AMD64
                executeFunction->GetInParamsCount() == 0 ?
                Js::JavascriptFunctionArgIndex_StackScopeSlotsNoArg :
#endif
                Js::JavascriptFunctionArgIndex_StackScopeSlots) - 2;

            localClosure = layout->GetArgv()[scopeSlotsIndex];
            newInstance->SetLocalClosure(localClosure);
        }
    }

    // Restore bailout values
    bailOutRecord->RestoreValues(bailOutKind, layout, newInstance, functionScriptContext, false, registerSaves, bailOutReturnValue, pArgumentsObject, branchValue, returnAddress, useStartCall, argoutRestoreAddress);

    // For functions that don't get the scope slot and frame display pointers back from the known stack locations
    // (see above), get them back from the designated registers.
    // In either case, clear the values from those registers, because the interpreter should not be able to access
    // those values through the registers (only through its private fields).

    if (localFrameDisplayReg != Js::Constants::NoRegister)
    {
        Js::FrameDisplay *frameDisplay = (Js::FrameDisplay*)newInstance->GetNonVarReg(localFrameDisplayReg);
        if (frameDisplay)
        {
            newInstance->SetLocalFrameDisplay(frameDisplay);
            newInstance->SetNonVarReg(localFrameDisplayReg, nullptr);
        }
    }

    if (localClosureReg != Js::Constants::NoRegister)
    {
        Js::Var closure = newInstance->GetNonVarReg(localClosureReg);
        if (closure)
        {
            bailOutRecord->globalBailOutRecordTable->isScopeObjRestored = true;
            newInstance->SetLocalClosure(closure);
            newInstance->SetNonVarReg(localClosureReg, nullptr);
        }
    }

    if (paramClosureReg != Js::Constants::NoRegister)
    {
        Js::Var closure = newInstance->GetNonVarReg(paramClosureReg);
        if (closure)
        {
            newInstance->SetParamClosure(closure);
            newInstance->SetNonVarReg(paramClosureReg, nullptr);
        }
    }

    if (bailOutRecord->globalBailOutRecordTable->hasStackArgOpt)
    {
        newInstance->TrySetFrameObjectInHeapArgObj(functionScriptContext, bailOutRecord->globalBailOutRecordTable->hasNonSimpleParams,
            bailOutRecord->globalBailOutRecordTable->isScopeObjRestored);
    }

    //Reset the value for tracking the restoration during next bail out.
    bailOutRecord->globalBailOutRecordTable->isScopeObjRestored = false;

    uint32 innerScopeCount = executeFunction->GetInnerScopeCount();
    for (uint32 i = 0; i < innerScopeCount; i++)
    {
        Js::RegSlot reg = executeFunction->GetFirstInnerScopeRegister() + i;
        newInstance->SetInnerScopeFromIndex(i, newInstance->GetNonVarReg(reg));
        newInstance->SetNonVarReg(reg, nullptr);
    }

    newInstance->SetClosureInitDone(bailOutOffset != 0 || !(bailOutKind & IR::BailOutForDebuggerBits));

    // RestoreValues may call EnsureArguments and cause functions to be boxed.
    // Since the interpreter frame that hasn't started yet, StackScriptFunction::Box would not have replaced the function object
    // in the restoring interpreter frame. Let's make sure the current interpreter frame has the unboxed version.
    // Note: Only use the unboxed version if we have replaced the function argument on the stack via boxing
    // so that the interpreter frame we are bailing out to matches the one in the function argument list
    // (which is used by the stack walker to match up stack frame and the interpreter frame).
    // Some function are boxed but we continue to use the stack version to call the function - those that only live in register
    // and are not captured in frame displays.
    // Those uses are fine, but that means the function argument list will have the stack function object that is passed it and
    // not be replaced with a just boxed one.

    Js::ScriptFunction * currentFunctionObject = *functionRef;
    if (function != currentFunctionObject)
    {
        Assert(currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function));
        newInstance->SetExecutingStackFunction(currentFunctionObject);
    }

    UpdatePolymorphicFieldAccess(function, bailOutRecord);

    BAILOUT_FLUSH(executeFunction);

    executeFunction->BeginExecution();

    // Restart at the bailout byte code offset.
    newInstance->m_reader.SetCurrentOffset(bailOutOffset);

    Js::Var aReturn = nullptr;

    {
        // Following _AddressOfReturnAddress <= real address of "returnAddress". Suffices for RemoteStackWalker to test partially initialized interpreter frame.
        Js::InterpreterStackFrame::PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, _AddressOfReturnAddress());
#ifdef ENABLE_SCRIPT_DEBUGGING
        aReturn = isInDebugMode ? newInstance->DebugProcess() : newInstance->Process();
#else
        aReturn = newInstance->Process();
#endif
        // Note: in debug mode we always have to bailout to debug thunk,
        //       as normal interpreter thunk expects byte code compiled w/o debugging.
    }

    executeFunction->EndExecution();

    if (executeFunction->HasDynamicProfileInfo())
    {
        Js::DynamicProfileInfo *dynamicProfileInfo = executeFunction->GetAnyDynamicProfileInfo();
        dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
    }

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   Return Value: 0x%p"), aReturn);
    if (bailOutRecord->globalBailOutRecordTable->isInlinedConstructor)
    {
        AssertMsg(!executeFunction->IsGenerator(), "Generator functions are not expected to be inlined. If this changes then need to use the real user args here from the generator object");
        Assert(args.Info.Count != 0);
        aReturn = Js::JavascriptFunction::FinishConstructor(aReturn, args.Values[0], function);

        Js::Var oldValue = aReturn;
        aReturn = Js::JavascriptOperators::BoxStackInstance(oldValue, functionScriptContext, /* allowStackFunction */ true, /* deepCopy */ false);
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (oldValue != aReturn)
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(" (Boxed: 0x%p)"), aReturn);
        }
#endif
    }
    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("\n"));
    return aReturn;
}